

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O0

void __thiscall libchess::Position::generate_castling(Position *this,MoveList *move_list,Color c)

{
  Bitboard rhs;
  Bitboard rhs_00;
  bool bVar1;
  value_type vVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RSI;
  Position *in_RDI;
  Bitboard occupancy;
  Bitboard castle_mask [2] [2];
  Square castling_king_sqs [2] [2] [2];
  Square castling_intermediate_sqs [2] [2] [2];
  int castling_possibilities [2] [2];
  Position *in_stack_fffffffffffffe98;
  Bitboard *in_stack_fffffffffffffea0;
  Move move;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  uint uVar5;
  uint in_stack_fffffffffffffec8;
  Color c_00;
  Square in_stack_fffffffffffffecc;
  Bitboard local_120;
  MetaValueType<int> local_118;
  undefined4 local_114;
  Bitboard local_110;
  MetaValueType<int> local_108;
  undefined4 local_104;
  Bitboard local_100;
  value_type local_f8;
  Bitboard local_f0;
  CastlingRights local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  MetaValueType<int> local_d8;
  undefined4 local_d4;
  Bitboard local_d0;
  MetaValueType<int> local_c8;
  undefined4 local_c4;
  Bitboard local_c0;
  MetaValueType<int> local_b8;
  undefined4 local_b4;
  Bitboard local_b0;
  value_type local_a8;
  Bitboard local_a0;
  CastlingRights local_94;
  value_type local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40 [3];
  uint local_28 [4];
  undefined8 local_18;
  MetaValueType local_4 [4];
  
  local_28[0] = 1;
  local_28[1] = 2;
  local_28[2] = 4;
  local_28[3] = 8;
  local_48 = 0x600000005;
  local_40[0] = 0x200000003;
  local_40[1] = 0x3e0000003d;
  local_40[2] = 0x3a0000003b;
  local_68 = 0x600000004;
  local_60 = 0x200000004;
  local_58 = 0x3e0000003c;
  local_50 = 0x3a0000003c;
  local_88 = 0x60;
  local_80 = 0xe;
  local_78 = 0x6000000000000000;
  local_70 = 0xe00000000000000;
  local_18 = in_RSI;
  local_90 = (value_type)occupancy_bb(in_RDI);
  vVar2 = MetaValueType::operator_cast_to_int(local_4);
  uVar5 = local_28[(long)vVar2 * 2];
  local_94 = castling_rights(in_stack_fffffffffffffe98);
  uVar3 = CastlingRights::value(&local_94);
  c_00.super_MetaValueType<int>.value_ = (MetaValueType<int>)(in_stack_fffffffffffffec8 & 0xffffff);
  if ((uVar5 & uVar3) != 0) {
    MetaValueType::operator_cast_to_int(local_4);
    local_a8 = local_90;
    rhs.value_._4_4_ = in_stack_fffffffffffffeac;
    rhs.value_._0_4_ = in_stack_fffffffffffffea8;
    local_a0 = Bitboard::operator&(in_stack_fffffffffffffea0,rhs);
    bVar1 = Bitboard::operator!(&local_a0);
    c_00.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)((uint)c_00.super_MetaValueType<int>.value_ & 0xffffff);
    if (bVar1) {
      vVar2 = MetaValueType::operator_cast_to_int(local_4);
      local_b4 = *(undefined4 *)(&local_68 + (long)vVar2 * 2);
      local_b8.value_ = (value_type)Color::operator!((Color *)in_stack_fffffffffffffe98);
      local_b0 = attackers_to((Position *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffecc,c_00);
      bVar1 = Bitboard::operator!(&local_b0);
      c_00.super_MetaValueType<int>.value_ =
           (MetaValueType<int>)((uint)c_00.super_MetaValueType<int>.value_ & 0xffffff);
      if (bVar1) {
        vVar2 = MetaValueType::operator_cast_to_int(local_4);
        local_c4 = *(undefined4 *)(&local_48 + (long)vVar2 * 2);
        local_c8.value_ = (value_type)Color::operator!((Color *)in_stack_fffffffffffffe98);
        local_c0 = attackers_to((Position *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                                in_stack_fffffffffffffecc,c_00);
        bVar1 = Bitboard::operator!(&local_c0);
        c_00.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)((uint)c_00.super_MetaValueType<int>.value_ & 0xffffff);
        if (bVar1) {
          vVar2 = MetaValueType::operator_cast_to_int(local_4);
          local_d4 = *(undefined4 *)((long)&local_48 + (long)vVar2 * 0x10 + 4);
          local_d8.value_ = (value_type)Color::operator!((Color *)in_stack_fffffffffffffe98);
          local_d0 = attackers_to((Position *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                                  in_stack_fffffffffffffecc,c_00);
          bVar1 = Bitboard::operator!(&local_d0);
          c_00.super_MetaValueType<int>.value_ =
               (MetaValueType<int>)CONCAT13(bVar1,SUB43(c_00.super_MetaValueType<int>.value_,0));
        }
      }
    }
  }
  if ((char)((uint)c_00.super_MetaValueType<int>.value_ >> 0x18) != '\0') {
    in_stack_fffffffffffffeb0 = local_18;
    vVar2 = MetaValueType::operator_cast_to_int(local_4);
    local_e0 = *(undefined4 *)(&local_68 + (long)vVar2 * 2);
    vVar2 = MetaValueType::operator_cast_to_int(local_4);
    local_e4 = *(undefined4 *)((long)&local_68 + (long)vVar2 * 0x10 + 4);
    Move::Move((Move *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (MetaValueType<int>)(value_type)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
               (MetaValueType<int>)(value_type)in_stack_fffffffffffffeb0,
               (Type)((ulong)in_stack_fffffffffffffea0 >> 0x38));
    MoveList::add((MoveList *)in_stack_fffffffffffffe98,
                  (Move)(value_type)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  }
  vVar2 = MetaValueType::operator_cast_to_int(local_4);
  uVar3 = local_28[(long)vVar2 * 2 + 1];
  local_e8 = castling_rights(in_stack_fffffffffffffe98);
  uVar4 = CastlingRights::value(&local_e8);
  in_stack_fffffffffffffeac = in_stack_fffffffffffffeac & 0xffffff;
  if ((uVar3 & uVar4) != 0) {
    MetaValueType::operator_cast_to_int(local_4);
    local_f8 = local_90;
    rhs_00.value_._4_4_ = in_stack_fffffffffffffeac;
    rhs_00.value_._0_4_ = uVar3;
    local_f0 = Bitboard::operator&(in_stack_fffffffffffffea0,rhs_00);
    bVar1 = Bitboard::operator!(&local_f0);
    in_stack_fffffffffffffeac = in_stack_fffffffffffffeac & 0xffffff;
    if (bVar1) {
      vVar2 = MetaValueType::operator_cast_to_int(local_4);
      local_104 = *(undefined4 *)(&local_68 + (long)vVar2 * 2);
      local_108.value_ = (value_type)Color::operator!((Color *)in_stack_fffffffffffffe98);
      local_100 = attackers_to((Position *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                               in_stack_fffffffffffffecc,c_00);
      bVar1 = Bitboard::operator!(&local_100);
      in_stack_fffffffffffffeac = in_stack_fffffffffffffeac & 0xffffff;
      if (bVar1) {
        vVar2 = MetaValueType::operator_cast_to_int(local_4);
        local_114 = *(undefined4 *)(local_40 + (long)vVar2 * 2);
        local_118.value_ = (value_type)Color::operator!((Color *)in_stack_fffffffffffffe98);
        local_110 = attackers_to((Position *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                                 in_stack_fffffffffffffecc,c_00);
        bVar1 = Bitboard::operator!(&local_110);
        in_stack_fffffffffffffeac = in_stack_fffffffffffffeac & 0xffffff;
        if (bVar1) {
          MetaValueType::operator_cast_to_int(local_4);
          Color::operator!((Color *)in_stack_fffffffffffffe98);
          local_120 = attackers_to((Position *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                                   in_stack_fffffffffffffecc,c_00);
          bVar1 = Bitboard::operator!(&local_120);
          in_stack_fffffffffffffeac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
        }
      }
    }
  }
  if ((char)(in_stack_fffffffffffffeac >> 0x18) != '\0') {
    move.value_ = local_18._4_4_;
    MetaValueType::operator_cast_to_int(local_4);
    MetaValueType::operator_cast_to_int(local_4);
    Move::Move((Move *)CONCAT44(in_stack_fffffffffffffeac,uVar3),
               (MetaValueType<int>)(value_type)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
               (MetaValueType<int>)(value_type)in_stack_fffffffffffffeb0,
               (Type)((uint)move.value_ >> 0x18));
    MoveList::add((MoveList *)in_stack_fffffffffffffe98,move);
  }
  return;
}

Assistant:

inline void Position::generate_castling(MoveList& move_list, Color c) const {
    const int castling_possibilities[2][2] = {
        {constants::WHITE_KINGSIDE.value(), constants::WHITE_QUEENSIDE.value()},
        {constants::BLACK_KINGSIDE.value(), constants::BLACK_QUEENSIDE.value()},
    };
    const Square castling_intermediate_sqs[2][2][2] = {
        {{constants::F1, constants::G1}, {constants::D1, constants::C1}},
        {{constants::F8, constants::G8}, {constants::D8, constants::C8}}};
    const Square castling_king_sqs[2][2][2] = {
        {{constants::E1, constants::G1}, {constants::E1, constants::C1}},
        {{constants::E8, constants::G8}, {constants::E8, constants::C8}}};
    const Bitboard castle_mask[2][2] = {
        {(Bitboard{constants::F1} | Bitboard{constants::G1}),
         (Bitboard{constants::D1} | Bitboard{constants::C1} | Bitboard{constants::B1})},
        {(Bitboard{constants::F8} | Bitboard{constants::G8}),
         (Bitboard{constants::D8} | Bitboard{constants::C8} | Bitboard{constants::B8})}};

    Bitboard occupancy = occupancy_bb();
    if ((castling_possibilities[c][0] & castling_rights().value()) &&
        !(castle_mask[c][0] & occupancy) && !(attackers_to(castling_king_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][0][1], !c))) {
        move_list.add(
            Move{castling_king_sqs[c][0][0], castling_king_sqs[c][0][1], Move::Type::CASTLING});
    }
    if ((castling_possibilities[c][1] & castling_rights().value()) &&
        !(castle_mask[c][1] & occupancy) && !(attackers_to(castling_king_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][1][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][1][1], !c))) {
        move_list.add(
            Move{castling_king_sqs[c][1][0], castling_king_sqs[c][1][1], Move::Type::CASTLING});
    }
}